

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

RuleBuilder * __thiscall Potassco::RuleBuilder::weaken(RuleBuilder *this,Body_t to,bool w)

{
  uint uVar1;
  uint uVar2;
  Rule *pRVar3;
  WeightLit_t *pWVar4;
  Lit_t *pLVar5;
  uint *puVar6;
  byte in_DL;
  MemoryRegion *in_RDI;
  Weight_t min;
  Weight_t bnd;
  uint32_t i;
  WeightLit_t *bEnd;
  WeightLit_t *bIt;
  Rule *r;
  int local_44;
  uint local_3c;
  WeightLit_t *local_30;
  Body_t local_c;
  MemoryRegion *local_8;
  
  pRVar3 = rule_((RuleBuilder *)0x264ec4);
  local_8 = in_RDI;
  if (*(uint *)&pRVar3->body >> 0x1e != 0) {
    uVar1 = *(uint *)&pRVar3->body >> 0x1e;
    uVar2 = Body_t::operator_cast_to_unsigned_int(&local_c);
    local_8 = in_RDI;
    if (uVar1 != uVar2) {
      local_30 = wlits_begin((RuleBuilder *)in_RDI);
      pWVar4 = wlits_end((RuleBuilder *)in_RDI);
      uVar2 = Body_t::operator_cast_to_unsigned_int(&local_c);
      if (uVar2 == 0) {
        local_3c = (*(uint *)&pRVar3->body & 0x3fffffff) - 4;
        Rule::Span::init(&pRVar3->body,(EVP_PKEY_CTX *)(ulong)local_3c);
        for (; local_30 != pWVar4; local_30 = local_30 + 1) {
          pLVar5 = (Lit_t *)MemoryRegion::operator[](in_RDI,(ulong)local_3c);
          *pLVar5 = local_30->lit;
          local_3c = local_3c + 4;
        }
        (pRVar3->body).mend = local_3c;
        puVar6 = std::max<unsigned_int>(&(pRVar3->head).mend,&(pRVar3->body).mend);
        *(uint *)pRVar3 = *(uint *)pRVar3 & 0x80000000 | *puVar6 & 0x7fffffff;
      }
      else {
        uVar2 = Body_t::operator_cast_to_unsigned_int(&local_c);
        if (((uVar2 == 2) && ((in_DL & 1) != 0)) && (local_30 != pWVar4)) {
          bound_((RuleBuilder *)in_RDI);
          local_44 = local_30->weight;
          for (; local_30 != pWVar4; local_30 = local_30 + 1) {
            if (local_30->weight < local_44) {
              local_44 = local_30->weight;
            }
            local_30->weight = 1;
          }
          setBound((RuleBuilder *)in_RDI,uVar1);
        }
      }
      uVar1 = Body_t::operator_cast_to_unsigned_int(&local_c);
      *(uint *)&pRVar3->body = *(uint *)&pRVar3->body & 0x3fffffff | uVar1 << 0x1e;
      local_8 = in_RDI;
    }
  }
  return (RuleBuilder *)local_8;
}

Assistant:

RuleBuilder& RuleBuilder::weaken(Body_t to, bool w) {
	Rule* r = rule_();
	if (r->body.type == Body_t::Normal || r->body.type == to) { return *this; }
	WeightLit_t* bIt = wlits_begin(), *bEnd = wlits_end();
	if (to == Body_t::Normal) {
		uint32_t i = r->body.mbeg - sizeof(Weight_t);
		r->body.init(i, 0);
		for (; bIt != bEnd; ++bIt, i += sizeof(Lit_t)) {
			new (mem_[i])Lit_t(bIt->lit);
		}
		r->body.mend = i;
		r->top = std::max(r->head.mend, r->body.mend);
	}
	else if (to == Body_t::Count && w && bIt != bEnd) {
		Weight_t bnd = *bound_(), min = bIt->weight;
		for (; bIt != bEnd; ++bIt) {
			if (min > bIt->weight) { min = bIt->weight; }
			bIt->weight = 1;
		}
		setBound((bnd+(min-1))/min);
	}
	r->body.type = to;
	return *this;
}